

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

Am_Value find_get_sel_widgets_impl_parent_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  Am_Object *in_RSI;
  Am_Value AVar4;
  Am_Object local_40;
  Am_Object sel_handles_command;
  Am_Object local_28;
  Am_Object sel_handles;
  Am_Object *self_local;
  Am_Value *value;
  
  sel_handles.data._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  pAVar2 = Am_Object::Get(in_RSI,0x197,0);
  Am_Object::Am_Object(&local_28,pAVar2);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_28,0xc5);
    bVar1 = Am_Object::Valid(&local_40);
    if (bVar1) {
      pAVar2 = Am_Object::Peek(&local_40,0x154,0);
      Am_Value::operator=((Am_Value *)self,pAVar2);
    }
    Am_Object::~Am_Object(&local_40);
  }
  sel_handles.data._7_1_ = 1;
  Am_Object::~Am_Object(&local_28);
  aVar3 = extraout_RDX;
  if ((sel_handles.data._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar3 = extraout_RDX_00;
  }
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, find_get_sel_widgets_impl_parent)
{
  Am_Value value;
  Am_Object sel_handles = self.Get(Am_SELECTION_WIDGET);
  if (sel_handles.Valid()) {
    Am_Object sel_handles_command = sel_handles.Get_Object(Am_COMMAND);
    if (sel_handles_command.Valid())
      value = sel_handles_command.Peek(Am_IMPLEMENTATION_PARENT);
  }
  return value;
}